

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_32U>::rehash
          (SmallDenseSet<TypePair,_TypePairHasher,_32U> *this)

{
  uint uVar1;
  TypePair *pTVar2;
  Allocator *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  TypePair *dst;
  long lVar5;
  
  uVar1 = this->bucketCount;
  pTVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    dst = (TypePair *)(*(code *)NULLC::alloc)(uVar1 << 5);
  }
  else {
    iVar4 = (*this->allocator->_vptr_Allocator[2])();
    dst = (TypePair *)CONCAT44(extraout_var,iVar4);
  }
  this->data = dst;
  NULLC::fillMemory(dst,0,(ulong)this->bucketCount << 4);
  this->count = 0;
  for (lVar5 = 0; (ulong)uVar1 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    if (*(long *)((long)&pTVar2->b + lVar5) != 0 || *(long *)((long)&pTVar2->a + lVar5) != 0) {
      insert(this,(TypePair *)((long)&pTVar2->a + lVar5));
    }
  }
  if (pTVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 != (Allocator *)0x0) {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,pTVar2);
      return;
    }
    (*(code *)NULLC::dealloc)(pTVar2);
    return;
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}